

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::EnumValueOptions::InternalSwap(EnumValueOptions *this,EnumValueOptions *other)

{
  bool bVar1;
  uint32 uVar2;
  int iVar3;
  void *pvVar4;
  Rep *pRVar5;
  UnknownFieldSet *other_00;
  
  internal::ExtensionSet::Swap(&this->_extensions_,&other->_extensions_);
  pvVar4 = (other->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    if (((ulong)pvVar4 & 1) == 0) goto LAB_002e8f2b;
LAB_002e8f1e:
    other_00 = (UnknownFieldSet *)((ulong)pvVar4 & 0xfffffffffffffffe);
  }
  else {
    if (((ulong)pvVar4 & 1) != 0) goto LAB_002e8f1e;
    other_00 = internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&(other->_internal_metadata_).
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
  }
  internal::InternalMetadataWithArena::DoSwap(&this->_internal_metadata_,other_00);
LAB_002e8f2b:
  uVar2 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar2;
  pRVar5 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_;
  (this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_ =
       (other->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_;
  (other->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_ = pRVar5;
  iVar3 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
  (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ =
       (other->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
  (other->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ = iVar3;
  iVar3 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.total_size_;
  (this->uninterpreted_option_).super_RepeatedPtrFieldBase.total_size_ =
       (other->uninterpreted_option_).super_RepeatedPtrFieldBase.total_size_;
  (other->uninterpreted_option_).super_RepeatedPtrFieldBase.total_size_ = iVar3;
  bVar1 = this->deprecated_;
  this->deprecated_ = other->deprecated_;
  other->deprecated_ = bVar1;
  return;
}

Assistant:

void EnumValueOptions::InternalSwap(EnumValueOptions* other) {
  using std::swap;
  _extensions_.Swap(&other->_extensions_);
  _internal_metadata_.Swap(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  uninterpreted_option_.InternalSwap(&other->uninterpreted_option_);
  swap(deprecated_, other->deprecated_);
}